

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

void __thiscall
llvm::cl::parser<char>::printOptionDiff
          (parser<char> *this,Option *O,char V,OptionValue<char> *D,size_t GlobalWidth)

{
  bool bVar1;
  uint NumSpaces;
  raw_ostream *prVar2;
  char *pcVar3;
  string Str;
  raw_string_ostream SS;
  
  basic_parser_impl::printOptionName((basic_parser_impl *)this,O,GlobalWidth);
  Str._M_dataplus._M_p = (pointer)&Str.field_2;
  Str._M_string_length = 0;
  Str.field_2._M_local_buf[0] = '\0';
  SS.super_raw_ostream.BufferMode = InternalBuffer;
  SS.super_raw_ostream.OutBufStart = (char *)0x0;
  SS.super_raw_ostream.OutBufEnd = (char *)0x0;
  SS.super_raw_ostream.OutBufCur = (char *)0x0;
  SS.super_raw_ostream._vptr_raw_ostream = (_func_int **)&PTR__raw_string_ostream_001f5230;
  SS.OS = &Str;
  raw_ostream::operator<<(&SS.super_raw_ostream,V);
  raw_string_ostream::~raw_string_ostream(&SS);
  prVar2 = outs();
  prVar2 = raw_ostream::operator<<(prVar2,"= ");
  raw_ostream::operator<<(prVar2,&Str);
  NumSpaces = 0;
  if (Str._M_string_length < 8) {
    NumSpaces = 8 - (int)Str._M_string_length;
  }
  prVar2 = outs();
  prVar2 = raw_ostream::indent(prVar2,NumSpaces);
  raw_ostream::operator<<(prVar2," (default: ");
  bVar1 = (D->super_OptionValueBase<char,_false>).super_OptionValueCopy<char>.Valid;
  prVar2 = outs();
  if (bVar1 == true) {
    pcVar3 = OptionValueCopy<char>::getValue((OptionValueCopy<char> *)D);
    raw_ostream::operator<<(prVar2,*pcVar3);
  }
  else {
    raw_ostream::operator<<(prVar2,"*no default*");
  }
  prVar2 = outs();
  raw_ostream::operator<<(prVar2,")\n");
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void parser<std::string>::printOptionDiff(const Option &O, StringRef V,
                                          const OptionValue<std::string> &D,
                                          size_t GlobalWidth) const {
  printOptionName(O, GlobalWidth);
  outs() << "= " << V;
  size_t NumSpaces = MaxOptWidth > V.size() ? MaxOptWidth - V.size() : 0;
  outs().indent(NumSpaces) << " (default: ";
  if (D.hasValue())
    outs() << D.getValue();
  else
    outs() << "*no default*";
  outs() << ")\n";
}